

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

RecyclableObject *
Js::JavascriptArray::ObjectSpliceHelper<unsigned_int>
          (RecyclableObject *pObj,uint len,uint start,uint deleteLen,Var *insertArgs,
          uint32 insertLen,ScriptContext *scriptContext,RecyclableObject *pNewObj)

{
  BigIndex idxDest;
  BOOL BVar1;
  uint uVar2;
  ThreadContext *threadContext;
  JavascriptLibrary *this;
  JavascriptArray *instance;
  Var pvVar3;
  Var *aItem;
  BigIndex index;
  BigIndex local_138;
  BigIndex local_128;
  uint32 local_114;
  undefined1 local_110 [4];
  uint newLen;
  uint local_fc;
  uint local_f8;
  uint32 i_4;
  uint dstIndex;
  uint i_3;
  Var element_2;
  uint local_e0;
  BOOL hasItem_2;
  uint i_2;
  uint j;
  undefined1 local_c8 [8];
  ThrowTypeErrorOnFailureHelper h;
  Var element_1;
  BOOL hasItem_1;
  uint i_1;
  BigIndex k;
  Var element;
  BOOL hasItem;
  uint32 i;
  JavascriptArray *pnewArr;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  uint32 insertLen_local;
  Var *insertArgs_local;
  uint deleteLen_local;
  uint start_local;
  uint len_local;
  RecyclableObject *pObj_local;
  
  aItem = insertArgs;
  jsReentLock._28_4_ = insertLen;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pObj);
  if (pNewObj == (RecyclableObject *)0x0) {
    JsReentLock::unlock((JsReentLock *)local_50);
    aItem = (Var *)0x0;
    pNewObj = ArraySpeciesCreate<unsigned_int>
                        (pObj,deleteLen,scriptContext,(bool *)0x0,(bool *)0x0,(bool *)0x0);
    JsReentLock::relock((JsReentLock *)local_50);
    if (pNewObj == (RecyclableObject *)0x0) {
      this = ScriptContext::GetLibrary(scriptContext);
      pNewObj = (RecyclableObject *)JavascriptLibrary::CreateArray(this,deleteLen);
      EnsureHead<void*>((JavascriptArray *)pNewObj);
    }
  }
  instance = TryVarToNonES5Array(pNewObj);
  if (instance == (JavascriptArray *)0x0) {
    BigIndex::BigIndex((BigIndex *)&hasItem_1,0);
    for (element_1._4_4_ = 0; element_1._4_4_ < deleteLen; element_1._4_4_ = element_1._4_4_ + 1) {
      JsReentLock::unlock((JsReentLock *)local_50);
      BVar1 = Js::JavascriptOperators::HasItem(pObj,start + element_1._4_4_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
      if (BVar1 != 0) {
        JsReentLock::unlock((JsReentLock *)local_50);
        pvVar3 = Js::JavascriptOperators::GetItem(pObj,start + element_1._4_4_,scriptContext);
        idxDest.bigIndex = (uint64)pvVar3;
        idxDest.index = k.index;
        idxDest._4_4_ = k._4_4_;
        uVar2 = SetArrayLikeObjects((JavascriptArray *)pNewObj,
                                    (RecyclableObject *)((ulong)_hasItem_1 & 0xffffffff),idxDest,
                                    aItem);
        h.m_functionName = _hasItem_1;
        index.bigIndex = (uint64)aItem;
        index.index = k.index;
        index._4_4_ = k._4_4_;
        ThrowErrorOnFailure((JavascriptArray *)(ulong)uVar2,(BOOL)scriptContext,
                            (ScriptContext *)((ulong)_hasItem_1 & 0xffffffff),index);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
      }
      BigIndex::operator++((BigIndex *)&hasItem_1);
    }
  }
  else {
    JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(instance);
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_50,instance);
    for (element._4_4_ = 0; element._4_4_ < deleteLen; element._4_4_ = element._4_4_ + 1) {
      JsReentLock::unlock((JsReentLock *)local_50);
      BVar1 = Js::JavascriptOperators::HasItem(pObj,start + element._4_4_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
      if (BVar1 != 0) {
        JsReentLock::unlock((JsReentLock *)local_50);
        k.bigIndex = (uint64)Js::JavascriptOperators::GetItem
                                       (pObj,start + element._4_4_,scriptContext);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
        (*(instance->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (instance,(ulong)element._4_4_,k.bigIndex,0);
      }
    }
  }
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailureHelper
            ((ThrowTypeErrorOnFailureHelper *)local_c8,scriptContext,L"Array.prototype.splice");
  if (deleteLen < (uint)jsReentLock._28_4_) {
    JsReentLock::unlock((JsReentLock *)local_50);
    BigIndex::BigIndex((BigIndex *)&i_2,start + jsReentLock._28_4_);
    Unshift<Js::JavascriptArray::BigIndex,unsigned_int>
              (pObj,(BigIndex *)&i_2,start + deleteLen,len,scriptContext);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    JsReentLock::relock((JsReentLock *)local_50);
  }
  else if ((uint)jsReentLock._28_4_ < deleteLen) {
    hasItem_2 = 0;
    for (local_e0 = start + deleteLen; i_4 = len, local_e0 < len; local_e0 = local_e0 + 1) {
      JsReentLock::unlock((JsReentLock *)local_50);
      element_2._4_4_ = Js::JavascriptOperators::HasItem(pObj,local_e0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
      if (element_2._4_4_ == 0) {
        JsReentLock::unlock((JsReentLock *)local_50);
        BVar1 = Js::JavascriptOperators::DeleteItem
                          (pObj,start + jsReentLock._28_4_ + hasItem_2,
                           PropertyOperation_ThrowOnDeleteIfNotConfig);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)local_c8,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
      }
      else {
        _dstIndex = (Var)0x0;
        JsReentLock::unlock((JsReentLock *)local_50);
        _dstIndex = Js::JavascriptOperators::GetItem(pObj,local_e0,scriptContext);
        BVar1 = Js::JavascriptOperators::SetItem
                          (pObj,pObj,start + jsReentLock._28_4_ + hasItem_2,_dstIndex,scriptContext,
                           PropertyOperation_ThrowIfNotExtensible,0);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)local_c8,BVar1);
        JsReentLock::MutateArrayObject((JsReentLock *)local_50);
        JsReentLock::relock((JsReentLock *)local_50);
      }
      hasItem_2 = hasItem_2 + 1;
    }
    for (; (len - deleteLen) + jsReentLock._28_4_ < i_4; i_4 = i_4 - 1) {
      JsReentLock::unlock((JsReentLock *)local_50);
      BVar1 = Js::JavascriptOperators::DeleteItem
                        (pObj,i_4 - 1,PropertyOperation_ThrowOnDeleteIfNotConfig);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_c8,BVar1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
    }
  }
  if (jsReentLock._28_4_ != 0) {
    local_f8 = start;
    for (local_fc = 0; local_fc < (uint)jsReentLock._28_4_; local_fc = local_fc + 1) {
      JsReentLock::unlock((JsReentLock *)local_50);
      BigIndex::BigIndex((BigIndex *)local_110,local_f8);
      BVar1 = IndexTrace<Js::JavascriptArray::BigIndex>::SetItem
                        (pObj,(BigIndex *)local_110,insertArgs[local_fc],
                         PropertyOperation_ThrowIfNotExtensible);
      ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                ((ThrowTypeErrorOnFailureHelper *)local_c8,BVar1);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      JsReentLock::relock((JsReentLock *)local_50);
      local_f8 = local_f8 + 1;
    }
  }
  local_114 = (len - deleteLen) + jsReentLock._28_4_;
  JsReentLock::unlock((JsReentLock *)local_50);
  BigIndex::BigIndex(&local_128,local_114);
  pvVar3 = IndexTrace<Js::JavascriptArray::BigIndex>::ToNumber(&local_128,scriptContext);
  BVar1 = Js::JavascriptOperators::SetProperty
                    (pObj,pObj,0xd1,pvVar3,scriptContext,PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)local_c8,BVar1);
  BigIndex::BigIndex(&local_138,deleteLen);
  pvVar3 = IndexTrace<Js::JavascriptArray::BigIndex>::ToNumber(&local_138,scriptContext);
  BVar1 = Js::JavascriptOperators::SetProperty
                    (pNewObj,pNewObj,0xd1,pvVar3,scriptContext,
                     PropertyOperation_ThrowIfNotExtensible);
  ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
            ((ThrowTypeErrorOnFailureHelper *)local_c8,BVar1);
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  JsReentLock::relock((JsReentLock *)local_50);
  if (instance != (JavascriptArray *)0x0) {
    (*(instance->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return pNewObj;
}

Assistant:

RecyclableObject* JavascriptArray::ObjectSpliceHelper(RecyclableObject* pObj, T len, T start,
        T deleteLen, Var* insertArgs, uint32 insertLen, ScriptContext *scriptContext, RecyclableObject* pNewObj)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pObj);

        JavascriptArray *pnewArr = nullptr;

        if (pNewObj == nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, pNewObj = ArraySpeciesCreate(pObj, deleteLen, scriptContext));
            if (pNewObj == nullptr)
            {
                if (deleteLen > UINT_MAX)
                {
                    JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
                }

                pnewArr = scriptContext->GetLibrary()->CreateArray(static_cast<uint32>(deleteLen));
                pnewArr->EnsureHead<Var>();

                pNewObj = pnewArr;
            }
        }

        pnewArr = JavascriptArray::TryVarToNonES5Array(pNewObj);
        if (pnewArr)
        {
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pnewArr);
#endif
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, pnewArr);
        }

        // copy elements to delete to new array
        if (pnewArr != nullptr)
        {
            for (uint32 i = 0; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    JS_REENTRANT(jsReentLock, Var element = JavascriptOperators::GetItem(pObj, start + i, scriptContext));
                    pnewArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            BigIndex k = 0u;
            for (T i = 0u; i < deleteLen; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, start + i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, start + i, scriptContext),
                        ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(pNewObj, k, element), scriptContext, k));
                }
                ++k;
            }
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.splice"));

        // Now we need reserve room if it is necessary
        if (insertLen > deleteLen) // Might overflow max array length
        {
            // Unshift [start + deleteLen, len) to start + insertLen
            JS_REENTRANT(jsReentLock, Unshift<BigIndex, T>(pObj, start + insertLen, start + deleteLen, len, scriptContext));
        }
        else if (insertLen < deleteLen) // Won't overflow max array length
        {
            T j = 0;
            for (T i = start + deleteLen; i < len; i++)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(pObj, i));
                if (hasItem)
                {
                    Var element = nullptr;
                    JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(pObj, i, scriptContext),
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(pObj, pObj, start + insertLen + j, element, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                }
                else
                {
                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, start + insertLen + j, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                }
                j++;
            }

            // Clean up the rest
            for (T i = len; i > len - deleteLen + insertLen; i--)
            {
                JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(pObj, i - 1, PropertyOperation_ThrowOnDeleteIfNotConfig)));
            }
        }

        if (insertLen > 0)
        {
            T dstIndex = start; // insert index might overflow max array length
            for (uint32 i = 0; i < insertLen; i++)
            {
                JS_REENTRANT(jsReentLock,
                    h.ThrowTypeErrorOnFailure(IndexTrace<BigIndex>::SetItem(pObj, dstIndex, insertArgs[i], PropertyOperation_ThrowIfNotExtensible)));
                ++dstIndex;
            }
        }

        // Set up new length
        T newLen = T(len - deleteLen) + insertLen;
        JS_REENTRANT(jsReentLock,
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pObj, pObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)),
            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetProperty(pNewObj, pNewObj, PropertyIds::length, IndexTrace<BigIndex>::ToNumber(deleteLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible)));
#ifdef VALIDATE_ARRAY
        if (pnewArr)
        {
            pnewArr->ValidateArray();
        }
#endif
        return pNewObj;
    }